

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QVariant * __thiscall
QListModel::data(QVariant *__return_storage_ptr__,QListModel *this,QModelIndex *index,int role)

{
  QListWidgetItem *pQVar1;
  bool bVar2;
  
  bVar2 = QModelIndex::isValid(index);
  if ((bVar2) && ((long)index->r < (this->items).d.size)) {
    pQVar1 = (this->items).d.ptr[index->r];
    (*pQVar1->_vptr_QListWidgetItem[3])(__return_storage_ptr__,pQVar1,(ulong)(uint)role);
  }
  else {
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QListModel::data(const QModelIndex &index, int role) const
{
    if (!index.isValid() || index.row() >= items.size())
        return QVariant();
    return items.at(index.row())->data(role);
}